

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int raviV_check_usertype(lua_State *L,TString *name,TValue *o)

{
  code cVar1;
  byte bVar2;
  ushort uVar3;
  GCObject *pGVar4;
  lua_CFunction p_Var5;
  TString *pTVar6;
  GCObject *pGVar7;
  uint __line;
  code *pcVar8;
  TValue *n;
  ushort uVar9;
  int iVar10;
  char *pcVar11;
  
  uVar3 = o->tt_;
  iVar10 = 0;
  uVar9 = uVar3 & 0x7f;
  if (uVar9 == 5) {
    if (uVar3 != 0x8005) {
      pcVar11 = "((((o))->tt_) == (((5) | (1 << 15))))";
LAB_00124632:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d3,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    if ((o->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
      pcVar11 = "(((o)->value_).gc)->tt == 5";
      goto LAB_00124632;
    }
    pcVar8 = (o->value_).f + 0x28;
  }
  else if (uVar9 == 7) {
    if (uVar3 != 0x8007) {
      pcVar11 = "((((o))->tt_) == (((7) | (1 << 15))))";
LAB_00124613:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d6,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    if ((o->value_).f[8] != (_func_int_lua_State_ptr)0x7) {
      pcVar11 = "(((o)->value_).gc)->tt == 7";
      goto LAB_00124613;
    }
    pcVar8 = (o->value_).f + 0x10;
  }
  else {
    if ((uVar9 != 0x25) && (uVar9 != 0x15)) {
      return 0;
    }
    if ((uVar3 != 0x8015) && (uVar3 != 0x8025)) {
      pcVar11 = 
      "(((((o))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((o))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_001245eb:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x4d0,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
    }
    cVar1 = (o->value_).f[8];
    if ((cVar1 != (code)0x15) && (cVar1 != (code)0x25)) {
      pcVar11 = 
      "((((o)->value_).gc)->tt == ((5) | ((1) << 4)) || (((o)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_001245eb;
    }
    pcVar8 = (o->value_).f + 0x38;
  }
  pGVar4 = *(GCObject **)pcVar8;
  if (pGVar4 == (GCObject *)0x0) {
    return 0;
  }
  if ((L->l_G->l_registry).tt_ != 0x8005) {
    pcVar11 = "((((&(L->l_G)->l_registry))->tt_) == (((5) | (1 << 15))))";
LAB_0012455c:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x4de,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
  }
  p_Var5 = (L->l_G->l_registry).value_.f;
  if (p_Var5[8] != (_func_int_lua_State_ptr)0x5) {
    pcVar11 = "(((&(L->l_G)->l_registry)->value_).gc)->tt == 5";
    goto LAB_0012455c;
  }
  if (name->tt != '\x04') {
    pcVar11 = "key->tt == ((4) | ((0) << 4))";
    __line = 0x5a;
    goto LAB_001245ad;
  }
  n = (TValue *)((ulong)(*(uint *)(p_Var5 + 0x38) & name->hash) * 0x20 + *(long *)(p_Var5 + 0x18));
  if ((((Node *)n)->i_key).nk.tt_ != 0x8004) {
LAB_0012450f:
    if ((((Node *)n)->i_key).nk.next == 0) {
      n = &luaO_nilobject_;
    }
    else {
      n = luaH_getshortstr_continue(name,(Node *)n);
    }
LAB_00124529:
    if ((((Node *)n)->i_val).tt_ == 0x8005) {
      pGVar7 = (((Node *)n)->i_val).value_.gc;
      if (pGVar7->tt != '\x05') {
        __assert_fail("(((metatab)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x4e0,"int raviV_check_usertype(lua_State *, TString *, const TValue *)");
      }
      if (pGVar7 == pGVar4) {
        iVar10 = 1;
      }
    }
    return iVar10;
  }
  pTVar6 = (TString *)(((Node *)n)->i_key).nk.value_.gc;
  bVar2 = pTVar6->tt;
  if ((bVar2 & 0xf) == 4) {
    if (bVar2 == 4) {
      if (pTVar6 == name) goto LAB_00124529;
      goto LAB_0012450f;
    }
    pcVar11 = 
    "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
    ;
  }
  else {
    pcVar11 = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
  }
  __line = 0x5c;
LAB_001245ad:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                ,__line,"const TValue *luaH_getshortstr(Table *, TString *)");
}

Assistant:

int raviV_check_usertype(lua_State *L, TString *name, const TValue *o)
{
  Table *mt;
  switch (ttype(o)) {
  case RAVI_TIARRAY:
  case RAVI_TFARRAY:
    mt = arrvalue(o)->metatable;
    break;
  case LUA_TTABLE:
    mt = hvalue(o)->metatable;
    break;
  case LUA_TUSERDATA:
    mt = uvalue(o)->metatable;
    break;
  default:
    mt = NULL;
  }
  if (mt == NULL)
    return 0;
  /* get global table from registry */
  Table *reg = hvalue(&G(L)->l_registry);
  const TValue *metatab = luaH_getshortstr(reg, name);
  return (!ttisnil(metatab) && ttisLtable(metatab) && hvalue(metatab) == mt) || 0;
}